

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O1

bool spvOpcodeIsDebug(Op opcode)

{
  if (((6 < opcode - OpSourceContinued) && (opcode != OpNoLine)) && (opcode != OpModuleProcessed)) {
    return false;
  }
  return true;
}

Assistant:

bool spvOpcodeIsDebug(spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpName:
    case spv::Op::OpMemberName:
    case spv::Op::OpSource:
    case spv::Op::OpSourceContinued:
    case spv::Op::OpSourceExtension:
    case spv::Op::OpString:
    case spv::Op::OpLine:
    case spv::Op::OpNoLine:
    case spv::Op::OpModuleProcessed:
      return true;
    default:
      return false;
  }
}